

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

Vector2f __thiscall Rml::Element::GetAbsoluteOffset(Element *this,BoxArea area)

{
  Box *this_00;
  Vector2f rhs;
  BoxArea area_local;
  Element *this_local;
  
  UpdateAbsoluteOffsetAndRenderBoxData(this);
  if (area == Border) {
    this_local = *(Element **)&this->absolute_offset;
  }
  else {
    this_00 = GetBox(this);
    rhs = Box::GetPosition(this_00,area);
    this_local = (Element *)Vector2<float>::operator+(&this->absolute_offset,rhs);
  }
  return (Vector2f)this_local;
}

Assistant:

Vector2f Element::GetAbsoluteOffset(BoxArea area)
{
	UpdateAbsoluteOffsetAndRenderBoxData();
	return area == BoxArea::Border ? absolute_offset : absolute_offset + GetBox().GetPosition(area);
}